

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O3

bool testMethod_compare(void)

{
  element_type *peVar1;
  string_view *this;
  undefined8 uVar2;
  undefined8 uVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  ostream *poVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  size_type __rlen;
  difference_type __diff;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  string_view sVar14;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  String str;
  undefined1 local_68 [32];
  String local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testMethod_compare()\n",0x15);
  cm::String::String<char_const(&)[2],void>(&local_48,(char (*) [2])0x903575);
  pcVar5 = local_48.view_._M_str;
  sVar4 = local_48.view_._M_len;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.view_._M_len ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001c62a8:
    iVar6 = 0x368;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(\"a\") > 0) failed on line ",0x31);
LAB_001c6303:
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  }
  else {
    uVar11 = (ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.view_._M_len !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
    iVar6 = memcmp(local_48.view_._M_str,"a",uVar11);
    if (iVar6 == 0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4 ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1 ||
          (long)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(sVar4 + -0x10))->
                        _M_weak_count + 3) < 0) goto LAB_001c62a8;
    }
    else if (iVar6 < 1) goto LAB_001c62a8;
    iVar6 = bcmp(pcVar5,"b",uVar11);
    if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4 !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) || (iVar6 != 0)) {
      iVar6 = 0x369;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(\"b\") == 0) failed on line ",0x32);
      goto LAB_001c6303;
    }
    iVar6 = memcmp(pcVar5,"c",uVar11);
    if (-1 < iVar6) {
      iVar6 = 0x36a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(\"c\") < 0) failed on line ",0x31);
      goto LAB_001c6303;
    }
    if ((byte)*pcVar5 < 0x62) {
      iVar6 = 0x36f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(a) > 0) failed on line ",0x2f);
    }
    else if (*pcVar5 == 0x62) {
      if ((byte)*pcVar5 < 99) {
        local_68[0] = 0x61;
        iVar6 = memcmp(pcVar5,local_68,uVar11);
        if ((iVar6 == 0) || (iVar6 < 1)) {
          iVar6 = 0x373;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(\'a\') > 0) failed on line ",
                     0x31);
        }
        else {
          local_68[0] = 0x62;
          iVar6 = bcmp(pcVar5,local_68,uVar11);
          if (iVar6 == 0) {
            local_68[0] = 99;
            iVar6 = memcmp(pcVar5,local_68,uVar11);
            if (iVar6 < 0) {
              peVar1 = (element_type *)(local_68 + 0x10);
              local_68._0_8_ = peVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"a","");
              uVar2 = local_68._0_8_;
              uVar11 = local_48.view_._M_len - local_68._8_8_;
              p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
              if (local_48.view_._M_len < (ulong)local_68._8_8_) {
                p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.view_._M_len;
              }
              if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001c648c:
                uVar12 = 0xffffffff80000000;
                if (-0x80000000 < (long)uVar11) {
                  uVar12 = uVar11;
                }
                if (0x7ffffffe < (long)uVar12) {
                  uVar12 = 0x7fffffff;
                }
              }
              else {
                uVar7 = memcmp(local_48.view_._M_str,(void *)local_68._0_8_,(size_t)p_Var10);
                uVar12 = (ulong)uVar7;
                if (uVar7 == 0) goto LAB_001c648c;
              }
              if ((element_type *)uVar2 != peVar1) {
                operator_delete((void *)uVar2,local_68._16_8_ + 1);
              }
              if ((int)uVar12 < 1) {
                iVar6 = 0x376;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(str.compare(std::string(\"a\")) > 0) failed on line ",0x3e);
              }
              else {
                local_68._0_8_ = peVar1;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"b","");
                sVar4 = local_48.view_._M_len;
                uVar3 = local_68._8_8_;
                uVar2 = local_68._0_8_;
                p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
                if (local_48.view_._M_len < (ulong)local_68._8_8_) {
                  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.view_._M_len;
                }
                if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001c6516:
                  bVar13 = sVar4 == uVar3;
                }
                else {
                  iVar6 = bcmp(local_48.view_._M_str,(void *)local_68._0_8_,(size_t)p_Var10);
                  if (iVar6 == 0) goto LAB_001c6516;
                  bVar13 = false;
                }
                if ((element_type *)uVar2 != peVar1) {
                  operator_delete((void *)uVar2,local_68._16_8_ + 1);
                }
                if (bVar13) {
                  local_68._0_8_ = peVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"c","");
                  uVar2 = local_68._0_8_;
                  uVar11 = local_48.view_._M_len - local_68._8_8_;
                  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
                  if (local_48.view_._M_len < (ulong)local_68._8_8_) {
                    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.view_._M_len;
                  }
                  if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001c6588:
                    uVar12 = 0xffffffff80000000;
                    if (-0x80000000 < (long)uVar11) {
                      uVar12 = uVar11;
                    }
                    if (0x7ffffffe < (long)uVar12) {
                      uVar12 = 0x7fffffff;
                    }
                  }
                  else {
                    uVar7 = memcmp(local_48.view_._M_str,(void *)local_68._0_8_,(size_t)p_Var10);
                    uVar12 = (ulong)uVar7;
                    if (uVar7 == 0) goto LAB_001c6588;
                  }
                  if ((element_type *)uVar2 != peVar1) {
                    operator_delete((void *)uVar2,local_68._16_8_ + 1);
                  }
                  pcVar5 = local_48.view_._M_str;
                  sVar4 = local_48.view_._M_len;
                  if ((int)uVar12 < 0) {
                    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.view_._M_len !=
                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      uVar11 = (ulong)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       local_48.view_._M_len !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
                      iVar6 = memcmp(local_48.view_._M_str,"a_",uVar11);
                      bVar13 = iVar6 < 0;
                      if (iVar6 == 0) {
                        bVar13 = (long)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                               (sVar4 + -0x10))->_M_weak_count + 3) < 0;
                      }
                      if ((iVar6 != 0 ||
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4 !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) && !bVar13) {
                        iVar6 = bcmp(pcVar5,"b_",uVar11);
                        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4 ==
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) && (iVar6 == 0)) {
                          iVar6 = memcmp(pcVar5,"c_",uVar11);
                          if (iVar6 < 0) {
                            cm::String::String<char_const(&)[2],void>
                                      ((String *)local_68,(char (*) [2])0x8efcd0);
                            sVar14 = cm::AsStringView<cm::String>::view((String *)local_68);
                            sVar4 = local_48.view_._M_len;
                            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar14._M_len;
                            p_Var10 = p_Var9;
                            if (local_48.view_._M_len < p_Var9) {
                              p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                        local_48.view_._M_len;
                            }
                            if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001c6739:
                              uVar11 = 0xffffffff80000000;
                              if (-0x80000000 < (long)(sVar4 - (long)p_Var9)) {
                                uVar11 = sVar4 - (long)p_Var9;
                              }
                              if (0x7ffffffe < (long)uVar11) {
                                uVar11 = 0x7fffffff;
                              }
                            }
                            else {
                              uVar7 = memcmp(local_48.view_._M_str,sVar14._M_str,(size_t)p_Var10);
                              uVar11 = (ulong)uVar7;
                              if (uVar7 == 0) goto LAB_001c6739;
                            }
                            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         local_68._8_8_);
                            }
                            if ((int)uVar11 < 1) {
                              iVar6 = 0x37c;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "ASSERT_TRUE(str.compare(cm::String(\"a\")) > 0) failed on line "
                                         ,0x3d);
                            }
                            else {
                              cm::String::String<char_const(&)[2],void>
                                        ((String *)local_68,(char (*) [2])0x903575);
                              sVar14 = cm::AsStringView<cm::String>::view((String *)local_68);
                              sVar4 = local_48.view_._M_len;
                              p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar14._M_len
                              ;
                              p_Var10 = p_Var9;
                              if (local_48.view_._M_len < p_Var9) {
                                p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                          local_48.view_._M_len;
                              }
                              if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001c67b9:
                                bVar13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar4 ==
                                         p_Var9;
                              }
                              else {
                                iVar6 = bcmp(local_48.view_._M_str,sVar14._M_str,(size_t)p_Var10);
                                if (iVar6 == 0) goto LAB_001c67b9;
                                bVar13 = false;
                              }
                              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                           local_68._8_8_);
                              }
                              if (bVar13) {
                                cm::String::String<char_const(&)[2],void>
                                          ((String *)local_68,(char (*) [2])0x9757a9);
                                sVar14 = cm::AsStringView<cm::String>::view((String *)local_68);
                                p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         sVar14._M_len;
                                p_Var10 = p_Var9;
                                if (local_48.view_._M_len < p_Var9) {
                                  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                            local_48.view_._M_len;
                                }
                                if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                {
LAB_001c681c:
                                  uVar11 = 0xffffffff80000000;
                                  if (-0x80000000 < (long)(local_48.view_._M_len - (long)p_Var9)) {
                                    uVar11 = local_48.view_._M_len - (long)p_Var9;
                                  }
                                  if (0x7ffffffe < (long)uVar11) {
                                    uVar11 = 0x7fffffff;
                                  }
                                }
                                else {
                                  uVar7 = memcmp(local_48.view_._M_str,sVar14._M_str,(size_t)p_Var10
                                                );
                                  uVar11 = (ulong)uVar7;
                                  if (uVar7 == 0) goto LAB_001c681c;
                                }
                                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_
                                    != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                             local_68._8_8_);
                                }
                                if ((int)uVar11 < 0) {
                                  this = &local_48.view_;
                                  __str._M_str = "a";
                                  __str._M_len = 1;
                                  iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::
                                          compare(this,0,1,__str);
                                  if (iVar6 < 1) {
                                    iVar6 = 0x37f;
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               "ASSERT_TRUE(str.compare(0, 1, cm::string_view(\"a\", 1)) > 0) failed on line "
                                               ,0x4b);
                                  }
                                  else {
                                    iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::
                                            compare(this,1,0,(
                                                  basic_string_view<char,_std::char_traits<char>_>)
                                                  (ZEXT816(0x98e619) << 0x40));
                                    if (iVar6 == 0) {
                                      __str_00._M_str = "ac";
                                      __str_00._M_len = 2;
                                      iVar6 = std::basic_string_view<char,_std::char_traits<char>_>
                                              ::compare(this,0,1,__str_00,1,1);
                                      if (iVar6 < 0) {
                                        iVar6 = std::
                                                basic_string_view<char,_std::char_traits<char>_>::
                                                compare(this,1,0,"");
                                        if (iVar6 == 0) {
                                          iVar6 = std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  compare(this,1,0,"_",0);
                                          if (iVar6 == 0) {
                                            bVar13 = true;
                                            goto LAB_001c6327;
                                          }
                                          iVar6 = 899;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,
                                                                                                          
                                                  "ASSERT_TRUE(str.compare(1, 0, \"_\", 0) == 0) failed on line "
                                                  ,0x3b);
                                        }
                                        else {
                                          iVar6 = 0x382;
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,
                                                                                                          
                                                  "ASSERT_TRUE(str.compare(1, 0, \"\") == 0) failed on line "
                                                  ,0x37);
                                        }
                                      }
                                      else {
                                        iVar6 = 0x381;
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(str.compare(0, 1, cm::string_view(\"ac\", 2), 1, 1) < 0) failed on line "
                                                  ,0x52);
                                      }
                                    }
                                    else {
                                      iVar6 = 0x380;
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,
                                                 "ASSERT_TRUE(str.compare(1, 0, cm::string_view(\"\", 0)) == 0) failed on line "
                                                 ,0x4b);
                                    }
                                  }
                                }
                                else {
                                  iVar6 = 0x37e;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "ASSERT_TRUE(str.compare(cm::String(\"c\")) < 0) failed on line "
                                             ,0x3d);
                                }
                              }
                              else {
                                iVar6 = 0x37d;
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "ASSERT_TRUE(str.compare(cm::String(\"b\")) == 0) failed on line "
                                           ,0x3e);
                              }
                            }
                          }
                          else {
                            iVar6 = 0x37b;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "ASSERT_TRUE(str.compare(cm::string_view(\"c_\", 1)) < 0) failed on line "
                                       ,0x46);
                          }
                        }
                        else {
                          iVar6 = 0x37a;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "ASSERT_TRUE(str.compare(cm::string_view(\"b_\", 1)) == 0) failed on line "
                                     ,0x47);
                        }
                        goto LAB_001c6303;
                      }
                    }
                    iVar6 = 0x379;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "ASSERT_TRUE(str.compare(cm::string_view(\"a_\", 1)) > 0) failed on line "
                               ,0x46);
                  }
                  else {
                    iVar6 = 0x378;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "ASSERT_TRUE(str.compare(std::string(\"c\")) < 0) failed on line ",
                               0x3e);
                  }
                }
                else {
                  iVar6 = 0x377;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "ASSERT_TRUE(str.compare(std::string(\"b\")) == 0) failed on line ",
                             0x3f);
                }
              }
            }
            else {
              iVar6 = 0x375;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(\'c\') < 0) failed on line "
                         ,0x31);
            }
          }
          else {
            iVar6 = 0x374;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(\'b\') == 0) failed on line ",
                       0x32);
          }
        }
        goto LAB_001c6303;
      }
      iVar6 = 0x371;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(c) < 0) failed on line ",0x2f);
    }
    else {
      iVar6 = 0x370;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.compare(b) == 0) failed on line ",0x30);
    }
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  }
  bVar13 = false;
LAB_001c6327:
  if (local_48.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar13;
}

Assistant:

static bool testMethod_front_back()
{
  std::cout << "testMethod_front_back()\n";
  cm::String str = "abc";
  ASSERT_TRUE(str.front() == 'a');
  ASSERT_TRUE(str.back() == 'c');
  return true;
}